

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  _Base_ptr *pp_Var1;
  cmExportSet *pcVar2;
  cmGeneratorTarget *this_00;
  cmTargetExport **ppcVar3;
  bool bVar4;
  TargetType TVar5;
  PolicyStatus PVar6;
  int iVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  char *pcVar10;
  ostream *poVar11;
  string *psVar12;
  char *pcVar13;
  uint uVar14;
  cmExportInstallFileGenerator *pcVar15;
  pointer pcVar17;
  pointer ppcVar18;
  undefined1 auVar19 [8];
  char cVar20;
  uint uVar21;
  pointer pbVar22;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar23;
  string expectedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  cmTargetExport *te;
  ostringstream e;
  undefined1 local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  cmTargetExport **local_208;
  undefined1 local_1f8;
  _Alloc_hider local_1f0;
  ulong local_1e8;
  undefined1 local_1e0 [8];
  undefined1 local_1d8 [40];
  cmTargetExport **local_1b0;
  undefined1 local_1a8 [16];
  _Base_ptr local_198;
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  undefined7 uVar16;
  
  local_218._0_8_ = (cmTargetExport **)0x0;
  local_218._8_8_ = (cmTargetExport **)0x0;
  local_208 = (cmTargetExport **)0x0;
  local_278._0_8_ = local_278 + 0x10;
  local_278._8_8_ = (pointer)0x0;
  local_278[0x10] = '\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity =
       local_258.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pcVar2 = this->IEGen->ExportSet;
  ppcVar18 = (pcVar2->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_1e0 = (undefined1  [8])os;
  if (ppcVar18 !=
      (pcVar2->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::operator+(&local_238,&local_258,&(this->super_cmExportFileGenerator).Namespace);
      cmGeneratorTarget::GetExportName_abi_cxx11_((string *)local_1d8,(*ppcVar18)->Target);
      uVar9 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        uVar9 = local_238.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < (pointer)(local_1d8._8_8_ + local_238._M_string_length)) {
        pcVar17 = (pointer)0xf;
        if ((cmTargetExport *)local_1d8._0_8_ != (cmTargetExport *)(local_1d8 + 0x10)) {
          pcVar17 = (pointer)local_1d8._16_8_;
        }
        if (pcVar17 < (pointer)(local_1d8._8_8_ + local_238._M_string_length)) goto LAB_0050a2aa;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)local_1d8,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
      }
      else {
LAB_0050a2aa:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_238,local_1d8._0_8_);
      }
      pp_Var1 = (_Base_ptr *)(puVar8 + 2);
      if ((_Base_ptr *)*puVar8 == pp_Var1) {
        local_198 = *pp_Var1;
        p_Stack_190 = (_Base_ptr)puVar8[3];
        local_1a8._0_8_ = &local_198;
      }
      else {
        local_198 = *pp_Var1;
        local_1a8._0_8_ = (_Base_ptr *)*puVar8;
      }
      local_1a8._8_8_ = puVar8[1];
      *puVar8 = pp_Var1;
      puVar8[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::_M_append(local_278,local_1a8._0_8_);
      if ((_Base_ptr *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)((long)&local_198->_M_color + 1));
      }
      if ((cmTargetExport *)local_1d8._0_8_ != (cmTargetExport *)(local_1d8 + 0x10)) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        (ulong)(local_238.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_258,0,(char *)local_258._M_string_length,0x64ea8a);
      local_1d8._0_8_ = *ppcVar18;
      pVar23 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)&(this->super_cmExportFileGenerator).ExportedTargets,
                          &((cmTargetExport *)local_1d8._0_8_)->Target);
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"install(EXPORT \"",0x10);
        pcVar2 = this->IEGen->ExportSet;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pcVar2->Name)._M_dataplus._M_p,
                             (pcVar2->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ...) ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"includes target \"",0x11);
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_
                            (*(cmGeneratorTarget **)(local_1d8._0_8_ + 0x20));
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\" more than once in the export set.",0x23);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(local_238._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          (ulong)(local_238.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,
                          (ulong)(local_258.field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
        }
        bVar4 = false;
        goto LAB_0050ab01;
      }
      if ((cmTargetExport **)local_218._8_8_ == local_208) {
        std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::
        _M_realloc_insert<cmTargetExport*const&>
                  ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)local_218._M_local_buf
                   ,(iterator)local_218._8_8_,(cmTargetExport **)local_1d8);
      }
      else {
        *(undefined8 *)local_218._8_8_ = local_1d8._0_8_;
        local_218._8_8_ = local_218._8_8_ + 8;
      }
      ppcVar18 = ppcVar18 + 1;
    } while (ppcVar18 !=
             (this->IEGen->ExportSet->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  auVar19 = local_1e0;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,local_1e0,local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,(ulong)(local_258.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x13])(this,auVar19);
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity = 0;
  if (local_218._0_8_ == local_218._8_8_) {
    cVar20 = '\0';
  }
  else {
    local_1e8 = 0;
    local_1f0._M_p = (pointer)0x0;
    _local_1f8 = 0;
    uVar9 = local_218._0_8_;
    pcVar15 = this;
    uVar21 = 0;
    do {
      this_00 = (*(cmTargetExport **)uVar9)->Target;
      uVar16 = (undefined7)((ulong)pcVar15 >> 8);
      uVar14 = (uint)CONCAT71(uVar16,1);
      local_1b0 = (cmTargetExport **)uVar9;
      if ((uVar21 & 1) == 0) {
        TVar5 = cmGeneratorTarget::GetType(this_00);
        uVar14 = (uint)CONCAT71(uVar16,TVar5 != INTERFACE_LIBRARY);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])(this,auVar19,this_00);
      ppcVar3 = local_1b0;
      local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
      local_198 = (_Base_ptr)0x0;
      p_Stack_190 = (_Base_ptr)(local_1a8 + 8);
      local_180 = 0;
      local_188 = p_Stack_190;
      cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                (&this->super_cmExportFileGenerator,*local_1b0,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258);
      cmExportFileGenerator::PopulateSourcesInterface
                (&this->super_cmExportFileGenerator,*ppcVar3,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258);
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,(string *)local_278,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"INTERFACE_COMPILE_DEFINITIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,(string *)local_278,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"INTERFACE_COMPILE_OPTIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,(string *)local_278,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"INTERFACE_AUTOUIC_OPTIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,(string *)local_278,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"INTERFACE_COMPILE_FEATURES","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,(string *)local_278,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258);
      local_1d8._36_4_ = uVar14;
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      PVar6 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
      if (PVar6 != WARN) {
        PVar6 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
        if (PVar6 != OLD) {
          bVar4 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                            (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                             (ImportPropertyMap *)local_1a8,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_258);
          if (bVar4) {
            _local_1f8 = CONCAT71((int7)((ulong)_local_1f8 >> 8),
                                  (byte)_local_1f8 |
                                  (this->super_cmExportFileGenerator).ExportOld ^ 1U);
          }
        }
      }
      TVar5 = cmGeneratorTarget::GetType(this_00);
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"INTERFACE_SOURCES","");
      pcVar10 = cmGeneratorTarget::GetProperty(this_00,(string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"INTERFACE_POSITION_INDEPENDENT_CODE","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,(string *)local_278,this_00,
                 (ImportPropertyMap *)local_1a8);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                (this,this_00,local_1e0);
      local_1f0._M_p =
           (pointer)CONCAT71((int7)((ulong)local_1f0._M_p >> 8),
                             (byte)local_1f0._M_p | TVar5 == INTERFACE_LIBRARY);
      local_1e8 = CONCAT71((int7)(local_1e8 >> 8),(byte)local_1e8 | pcVar10 != (char *)0x0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1a8);
      auVar19 = local_1e0;
      uVar9 = local_1b0 + 1;
      cVar20 = (char)local_1d8._36_4_;
      pcVar15 = (cmExportInstallFileGenerator *)local_278;
      uVar21 = local_1d8._36_4_;
    } while (uVar9 != local_218._8_8_);
    if ((((byte)local_1e8 | (byte)local_1f0._M_p | local_1f8) & 1) != 0) {
      pcVar10 = "2.8.12";
      if (((ulong)local_1f0._M_p & 1) != 0) {
        pcVar10 = "3.0.0";
      }
      pcVar13 = "3.1.0";
      if ((local_1e8 & 1) == 0) {
        pcVar13 = pcVar10;
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                (this,local_1e0,pcVar13);
    }
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x14])(this,auVar19);
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(this,auVar19);
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,auVar19);
  bVar4 = true;
  if ((cVar20 != '\0') &&
     (pbVar22 = (this->super_cmExportFileGenerator).Configurations.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
     pbVar22 !=
     (this->super_cmExportFileGenerator).Configurations.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar4 = true;
    do {
      iVar7 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
                        (this,pbVar22,&local_258);
      bVar4 = (bool)(bVar4 & (byte)iVar7);
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 !=
             (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,auVar19,&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_258);
LAB_0050ab01:
  if ((cmTargetExport **)local_218._0_8_ != (cmTargetExport **)0x0) {
    operator_delete((void *)local_218._0_8_,(long)local_208 - local_218._0_8_);
  }
  return bVar4;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::vector<cmTargetExport*>::const_iterator tei =
           this->IEGen->GetExportSet()->GetTargetExports()->begin();
         tei != this->IEGen->GetExportSet()->GetTargetExports()->end();
         ++tei) {
      expectedTargets +=
        sep + this->Namespace + (*tei)->Target->GetExportName();
      sep = " ";
      cmTargetExport* te = *tei;
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te);
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str().c_str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (std::vector<cmTargetExport*>::const_iterator tei = allTargets.begin();
       tei != allTargets.end(); ++tei) {
    cmGeneratorTarget* gt = (*tei)->Target;

    requiresConfigFiles =
      requiresConfigFiles || gt->GetType() != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      *tei, cmGeneratorExpression::InstallInterface, properties,
      missingTargets);
    this->PopulateSourcesInterface(*tei,
                                   cmGeneratorExpression::InstallInterface,
                                   properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties,
            missingTargets) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::vector<std::string>::const_iterator ci =
           this->Configurations.begin();
         ci != this->Configurations.end(); ++ci) {
      if (!this->GenerateImportFileConfig(*ci, missingTargets)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}